

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1185e52::QChildProcess::~QChildProcess(QChildProcess *this)

{
  EVP_PKEY_CTX *in_RSI;
  QChildProcess *in_RDI;
  
  cleanup(in_RDI,in_RSI);
  CharPointerList::~CharPointerList((CharPointerList *)in_RDI);
  CharPointerList::~CharPointerList((CharPointerList *)in_RDI);
  return;
}

Assistant:

~QChildProcess() noexcept(false)
    {
        cleanup();
    }